

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O1

UINT8 Pulse_Create(void **retDrvObj)

{
  UINT8 UVar1;
  UINT8 UVar2;
  void *drvObj;
  char *pcVar3;
  UINT8 UVar4;
  
  drvObj = malloc(0x70);
  *(undefined1 *)((long)drvObj + 8) = 0;
  *(undefined8 *)((long)drvObj + 0x30) = 0;
  *(undefined8 *)((long)drvObj + 0x38) = 0;
  *(undefined8 *)((long)drvObj + 0x40) = 0;
  *(undefined8 *)((long)drvObj + 0x48) = 0;
  *(undefined8 *)((long)drvObj + 0x60) = 0;
  *(undefined8 *)((long)drvObj + 0x68) = 0;
  pcVar3 = strdup("libvgm");
  *(char **)((long)drvObj + 0x58) = pcVar3;
  activeDrivers = activeDrivers + 1;
  UVar4 = '\0';
  UVar1 = OSSignal_Init((OS_SIGNAL **)((long)drvObj + 0x38),'\0');
  UVar2 = OSMutex_Init((OS_MUTEX **)((long)drvObj + 0x40),'\0');
  if (UVar2 != '\0' || UVar1 != '\0') {
    Pulse_Destroy(drvObj);
    UVar4 = 0xf0;
    drvObj = (void *)0x0;
  }
  *retDrvObj = drvObj;
  return UVar4;
}

Assistant:

UINT8 Pulse_Create(void** retDrvObj)
{
	DRV_PULSE* drv;
	UINT8 retVal8;
	
	drv = (DRV_PULSE*)malloc(sizeof(DRV_PULSE));
	drv->devState = 0;
	drv->hPulse = NULL;
	drv->hThread = NULL;
	drv->hSignal = NULL;
	drv->hMutex = NULL;
	drv->userParam = NULL;
	drv->FillBuffer = NULL;
	drv->streamDesc = strdup("libvgm");
	
	activeDrivers ++;
	retVal8  = OSSignal_Init(&drv->hSignal, 0);
	retVal8 |= OSMutex_Init(&drv->hMutex, 0);
	if (retVal8)
	{
		Pulse_Destroy(drv);
		*retDrvObj = NULL;
		return AERR_API_ERR;
	}
	*retDrvObj = drv;
	
	return AERR_OK;
}